

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# terminal.c
# Opt level: O3

void term_invalidate(Terminal *term)

{
  uint *puVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  termchar *ptVar4;
  long lVar5;
  long lVar6;
  
  wVar2 = term->rows;
  if (0 < (long)wVar2) {
    wVar3 = term->cols;
    lVar5 = 0;
    do {
      if (L'\0' < wVar3) {
        ptVar4 = term->disptext[lVar5]->chars;
        lVar6 = 0;
        do {
          puVar1 = (uint *)((long)&ptVar4->attr + lVar6);
          *puVar1 = *puVar1 | 0x3ffff;
          lVar6 = lVar6 + 0x20;
        } while ((ulong)(uint)wVar3 << 5 != lVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != wVar2);
  }
  if (term->window_update_pending != false) {
    return;
  }
  term->window_update_pending = true;
  queue_toplevel_callback(term_update_callback,term);
  return;
}

Assistant:

void term_invalidate(Terminal *term)
{
    int i, j;

    for (i = 0; i < term->rows; i++)
        for (j = 0; j < term->cols; j++)
            term->disptext[i]->chars[j].attr |= ATTR_INVALID;

    term_schedule_update(term);
}